

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O1

void pce_incbat(int *ip)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  int h;
  int w;
  int y;
  int x;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  long local_48;
  uchar *local_40;
  long local_38;
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar3 = pcx_get_args(ip);
  if (iVar3 != 0) {
    iVar3 = pcx_parse_args(1,pcx_nb_args + -1,&local_4c,&local_50,(int *)&local_54,&local_58,8);
    if (iVar3 != 0) {
      if ((pass == 1) && (local_38 = (long)local_58, 0 < local_38)) {
        uVar4 = pcx_arg[0] >> 4;
        local_40 = pcx_buf + local_4c;
        local_48 = (long)local_50;
        lVar7 = (long)pcx_w;
        lVar8 = 0;
        bVar2 = false;
        iVar3 = 0;
        do {
          if (0 < (int)local_54) {
            uVar9 = 0;
            do {
              pbVar10 = local_40 + uVar9 * 8 + (local_48 + lVar8 * 8) * lVar7;
              bVar1 = *pbVar10;
              iVar6 = 0;
              do {
                lVar5 = 0;
                do {
                  if (0xf < (pbVar10[lVar5] ^ bVar1)) {
                    bVar2 = true;
                  }
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 8);
                pbVar10 = pbVar10 + lVar7;
                iVar6 = iVar6 + 1;
              } while (iVar6 != 8);
              buffer[(uint)(iVar3 * 2)] = (uchar)uVar4;
              buffer[(ulong)(uint)(iVar3 * 2) + 1] = (byte)(uVar4 >> 8) & 0xf | bVar1 & 0xf0;
              iVar3 = iVar3 + 1;
              uVar4 = uVar4 + 1;
              uVar9 = uVar9 + 1;
            } while (uVar9 != local_54);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != local_38);
        if (bVar2) {
          error("Invalid color index found!");
        }
      }
      putbuffer(buffer,local_54 * local_58 * 2);
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
pce_incbat(int *ip)
{
	unsigned char *ptr, ref;
	int i, j, k, l, x, y, w, h;
	unsigned int base, index, flag;
	unsigned int temp;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(1, pcx_nb_args - 1, &x, &y, &w, &h, 8))
		return;

	/* build the BAT */
	if (pass == LAST_PASS) {
		index = 0;
		flag  = 0;
		base  = (pcx_arg[0] >> 4);

		for (i = 0; i < h; i++) {
			for (j = 0; j < w; j++) {
				ptr = pcx_buf + (x + (j * 8)) + ((y + (i * 8)) * pcx_w);
				ref = ptr[0] & 0xF0;

				/* check colors */
				for (k = 0; k < 8; k++) {
					for (l = 0; l < 8; l++) {
						if ((ptr[l] & 0xF0) != ref)
							flag = 1;
					}				
					ptr += pcx_w;
				}
				temp = (base & 0xFFF) | ((ref & 0xF0) << 8);
				buffer[2*index]   = temp & 0xff;
				buffer[2*index+1] = temp >> 8;

				index++;
				base++;
			}
		}

		/* errors */
		if (flag)
			error("Invalid color index found!");
	}

	/* store data */
	putbuffer(buffer, 2 * w * h);

	/* output */
	if (pass == LAST_PASS)
		println();
}